

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

bool helics::CoreFactory::registerCore(shared_ptr<helics::Core> *core,CoreType type)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
  }
  else {
    iVar3 = (*peVar1->_vptr_Core[0xc])();
    std::__cxx11::string::string
              ((string *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar3));
    if ((core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)core);
      bVar2 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addObject
                        ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,
                         &local_40,(shared_ptr<helics::Core> *)&local_50,type);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if (bVar2) {
        CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)core);
        gmlc::concurrency::DelayedDestructor<helics::Core>::addObjectsToBeDestroyed
                  ((DelayedDestructor<helics::Core> *)delayedDestroyer,
                   (shared_ptr<helics::Core> *)&local_60);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount)
        ;
        bVar2 = true;
        addExtraTypes(&local_40,type);
        goto LAB_00272dd2;
      }
    }
  }
  bVar2 = false;
LAB_00272dd2:
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool registerCore(const std::shared_ptr<Core>& core, CoreType type)
{
    bool res = false;
    const std::string& cname = (core) ? core->getIdentifier() : std::string{};
    if (core) {
        res = searchableCores.addObject(cname, core, type);
    }
    if (res) {
        delayedDestroyer.addObjectsToBeDestroyed(core);
        addExtraTypes(cname, type);
    }
    return res;
}